

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

BOOL Js::JavascriptArray::GetParamForIndexOf<unsigned_long>
               (unsigned_long length,Arguments *args,Var *search,unsigned_long *fromIndex,
               ScriptContext *scriptContext)

{
  Var arg;
  unsigned_long uVar1;
  RecyclableObject *pRVar2;
  BOOL BVar3;
  
  BVar3 = 0;
  if (length != 0) {
    if ((*(uint *)&args->Info & 0xffffff) < 3) {
      *fromIndex = 0;
      if (((ulong)args->Info & 0xfffffe) == 0) {
        pRVar2 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      else {
        pRVar2 = (RecyclableObject *)Arguments::operator[](args,1);
      }
    }
    else {
      arg = Arguments::operator[](args,2);
      uVar1 = GetFromIndex<unsigned_long>(arg,length,scriptContext,true);
      *fromIndex = uVar1;
      if (length <= uVar1) {
        return 0;
      }
      pRVar2 = (RecyclableObject *)Arguments::operator[](args,1);
    }
    *search = pRVar2;
    BVar3 = 1;
  }
  return BVar3;
}

Assistant:

BOOL JavascriptArray::GetParamForIndexOf(T length, Arguments const& args, Var& search, T& fromIndex, ScriptContext * scriptContext)
    {
        if (length == 0)
        {
            return false;
        }

        if (args.Info.Count > 2)
        {
            fromIndex = GetFromIndex(args[2], length, scriptContext);
            if (fromIndex >= length)
            {
                return false;
            }
            search = args[1];
        }
        else
        {
            fromIndex = 0;
            search = args.Info.Count > 1 ? args[1] : scriptContext->GetLibrary()->GetUndefined();
        }
        return true;
    }